

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  uint uVar1;
  int i;
  uint uVar2;
  long lVar3;
  ushort uVar4;
  char *pcVar5;
  long lStack_30;
  
  if (((ulong)text_color & 1) == 0) {
    uVar1 = text_color.value.rgb_color & 0xff;
    this->buffer[0] = '\x1b';
    this->buffer[1] = '[';
    uVar2 = uVar1 + 10;
    if (esc != "\x1b[48;2;") {
      uVar2 = uVar1;
    }
    uVar4 = (ushort)uVar2;
    if (uVar2 < 100) {
      lStack_30 = 2;
    }
    else {
      this->buffer[2] = '1';
      uVar4 = uVar4 % 100;
      lStack_30 = 3;
    }
    pcVar5 = this->buffer + lStack_30 + 3;
    pcVar5[-3] = (byte)((uVar4 & 0xff) / 10) | 0x30;
    pcVar5[-2] = (byte)((uVar4 & 0xff) % 10) | 0x30;
    pcVar5[-1] = 'm';
  }
  else {
    for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
      this->buffer[lVar3] = esc[lVar3];
    }
    to_esc(text_color.value._2_1_,this->buffer + 7,';');
    to_esc(text_color.value._1_1_,this->buffer + 0xb,';');
    to_esc(text_color.value._0_1_,this->buffer + 0xf,'m');
    pcVar5 = this->buffer + 0x13;
  }
  *pcVar5 = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) FMT_NOEXCEPT {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == detail::data::background_color;
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }